

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O1

WORD32 ihevc_buf_mgr_check_free(buf_mgr_t *ps_buf_mgr)

{
  long lVar1;
  
  if (ps_buf_mgr->u4_max_buf_cnt != 0) {
    lVar1 = 0;
    do {
      if (ps_buf_mgr->au4_status[lVar1] == 0) {
        if (ps_buf_mgr->apv_ptr[lVar1] != (void *)0x0) {
          return 1;
        }
      }
      else if (ps_buf_mgr->au4_status[lVar1] == 2) {
        __assert_fail("(ps_buf_mgr->au4_status[id] != 2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                      ,0xd5,"WORD32 ihevc_buf_mgr_check_free(buf_mgr_t *)");
      }
      lVar1 = lVar1 + 1;
    } while (ps_buf_mgr->u4_max_buf_cnt != (UWORD32)lVar1);
  }
  return 0;
}

Assistant:

WORD32 ihevc_buf_mgr_check_free(
                buf_mgr_t *ps_buf_mgr)
{
    UWORD32 id;

    for(id = 0; id < ps_buf_mgr->u4_max_buf_cnt; id++)
    {
        ASSERT(ps_buf_mgr->au4_status[id] != 2);

        if((ps_buf_mgr->au4_status[id] == 0) &&
           (ps_buf_mgr->apv_ptr[id]))
        {
            return 1;
        }
    }

    return 0;

}